

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_AES_PDF.cc
# Opt level: O2

void __thiscall Pl_AES_PDF::finish(Pl_AES_PDF *this)

{
  ulong uVar1;
  byte bVar2;
  unsigned_long in_RAX;
  logic_error *this_00;
  unsigned_long local_18;
  
  uVar1 = this->offset;
  local_18 = in_RAX;
  if (this->encrypt == true) {
    if (uVar1 == 0x10) {
      flush(this,false);
    }
    if (this->disable_padding != false) goto LAB_00129f26;
    local_18 = 0x10 - this->offset;
    bVar2 = QIntC::IntConverter<unsigned_long,_unsigned_char,_false,_false>::convert(&local_18);
    memset(this->inbuf + this->offset,(uint)bVar2,(ulong)bVar2);
    this->offset = 0x10;
    bVar2 = false;
  }
  else {
    if (uVar1 != 0x10) {
      if (0xf < uVar1) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"buffer overflow in AES encryption pipeline");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      memset(this->inbuf + uVar1,0,0x10 - uVar1);
      this->offset = 0x10;
    }
    bVar2 = this->disable_padding ^ 1;
  }
  flush(this,(bool)bVar2);
LAB_00129f26:
  (*((this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_QPDFCryptoImpl[0x10])();
  (*((this->super_Pipeline).next_)->_vptr_Pipeline[3])();
  return;
}

Assistant:

void
Pl_AES_PDF::finish()
{
    if (this->encrypt) {
        if (this->offset == this->buf_size) {
            flush(false);
        }
        if (!this->disable_padding) {
            // Pad as described in section 3.5.1 of version 1.7 of the PDF specification, including
            // providing an entire block of padding if the input was a multiple of 16 bytes.
            unsigned char pad = QIntC::to_uchar(this->buf_size - this->offset);
            memset(this->inbuf + this->offset, pad, pad);
            this->offset = this->buf_size;
            flush(false);
        }
    } else {
        if (this->offset != this->buf_size) {
            // This is never supposed to happen as the output is always supposed to be padded.
            // However, we have encountered files for which the output is not a multiple of the
            // block size.  In this case, pad with zeroes and hope for the best.
            if (this->offset >= this->buf_size) {
                throw std::logic_error("buffer overflow in AES encryption pipeline");
            }
            std::memset(this->inbuf + this->offset, 0, this->buf_size - this->offset);
            this->offset = this->buf_size;
        }
        flush(!this->disable_padding);
    }
    this->crypto->rijndael_finalize();
    next()->finish();
}